

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_marktrace(global_State *g,TraceNo traceno)

{
  uint uVar1;
  ulong uVar2;
  GCobj *o;
  TraceNo traceno_local;
  global_State *g_local;
  
  uVar1 = *(uint *)(*(long *)(g[1].gcroot + 0xc) + (ulong)traceno * 4);
  uVar2 = (ulong)uVar1;
  if ((*(byte *)(uVar2 + 4) & 3) != 0) {
    *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
    *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
    (g->gc).gray.gcptr32 = uVar1;
  }
  return;
}

Assistant:

static void gc_marktrace(global_State *g, TraceNo traceno)
{
  GCobj *o = obj2gco(traceref(G2J(g), traceno));
  lua_assert(traceno != G2J(g)->cur.traceno);
  if (iswhite(o)) {
    white2gray(o);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}